

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v5::
         format_to<char_const*,std::__cxx11::string,bidfx_public_api::price::provider::Provider::Status,std::__cxx11::string,500ul,char>
                   (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf,char **format_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   Status *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  char *s;
  size_t sVar1;
  iterator iVar2;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  pointer local_58;
  size_type sStack_50;
  Status *local_48;
  code *local_40;
  pointer local_38;
  size_type sStack_30;
  
  s = *format_str;
  sVar1 = internal::length<char>(s);
  local_58 = (args->_M_dataplus)._M_p;
  sStack_50 = args->_M_string_length;
  local_40 = internal::
             value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ::format_custom_arg<bidfx_public_api::price::provider::Provider::Status>;
  local_38 = (args_2->_M_dataplus)._M_p;
  sStack_30 = args_2->_M_string_length;
  format_str_00.size_ = sVar1;
  format_str_00.data_ = s;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_58;
  args_00.types_ = 0xbdb;
  local_48 = args_1;
  iVar2 = vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((range)buf,format_str_00,args_00);
  return (iterator)iVar2.container;
}

Assistant:

inline typename buffer_context<Char>::type::iterator format_to(
    basic_memory_buffer<Char, SIZE> &buf, const String &format_str,
    const Args & ... args) {
  internal::check_format_string<Args...>(format_str);
  return vformat_to(
        buf, basic_string_view<Char>(format_str),
        make_format_args<typename buffer_context<Char>::type>(args...));
}